

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O0

void __thiscall
wallet::feebumper::feebumper_tests::external_max_weight_test::test_method
          (external_max_weight_test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb98;
  allocator_type *in_stack_fffffffffffffbc0;
  allocator<char> *in_stack_fffffffffffffbc8;
  iterator in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  undefined1 *local_3e8;
  undefined1 *local_388;
  string *in_stack_fffffffffffffc88;
  string *prevout_script_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *witness_str_stack;
  string *in_stack_fffffffffffffc98;
  string *script_str;
  undefined1 *local_338;
  allocator<char> local_26d [2];
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269 [28];
  allocator<char> local_24d;
  allocator<char> local_24c;
  undefined1 local_24b;
  undefined1 local_24a [29];
  allocator<char> local_22d;
  allocator<char> local_22c [2];
  allocator<char> local_22a;
  allocator<char> local_229 [25];
  int64_t in_stack_fffffffffffffdf0;
  allocator<char> local_1e9 [33];
  undefined1 local_1c8 [96];
  undefined1 local_168 [64];
  undefined1 local_128 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined1 local_e8 [64];
  undefined1 local_a8 [64];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  CheckMaxWeightComputation
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb98);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffb88);
  __l._M_len = (size_type)in_stack_fffffffffffffbd8;
  __l._M_array = in_stack_fffffffffffffbd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbc8,__l,in_stack_fffffffffffffbc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  CheckMaxWeightComputation
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(local_22c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb88);
  local_338 = local_68;
  do {
    local_338 = local_338 + -0x20;
    std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  } while (local_338 != local_a8);
  std::allocator<char>::~allocator(&local_22a);
  std::allocator<char>::~allocator(local_229);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  witness_str_stack = &local_108;
  script_str = (string *)local_24a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  prevout_script_str = (string *)&local_24b;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffb88);
  __l_00._M_len = (size_type)in_stack_fffffffffffffbd8;
  __l_00._M_array = in_stack_fffffffffffffbd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbc8,__l_00,in_stack_fffffffffffffbc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  CheckMaxWeightComputation
            (script_str,witness_str_stack,prevout_script_str,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(&local_24c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb88);
  local_388 = local_e8;
  do {
    local_388 = local_388 + -0x20;
    std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  } while (local_388 != local_128);
  std::allocator<char>::~allocator((allocator<char> *)local_24a);
  std::allocator<char>::~allocator((allocator<char> *)(local_24a + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(&local_22d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffb88);
  __l_01._M_len = (size_type)in_stack_fffffffffffffbd8;
  __l_01._M_array = in_stack_fffffffffffffbd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbc8,__l_01,in_stack_fffffffffffffbc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  CheckMaxWeightComputation
            (script_str,witness_str_stack,prevout_script_str,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(local_26d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb88);
  local_3e8 = local_168;
  do {
    local_3e8 = local_3e8 + -0x20;
    std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  } while (local_3e8 != local_1c8);
  std::allocator<char>::~allocator(&local_26b);
  std::allocator<char>::~allocator(&local_26a);
  std::allocator<char>::~allocator(local_269);
  std::__cxx11::string::~string(in_stack_fffffffffffffb88);
  std::allocator<char>::~allocator(&local_24d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(external_max_weight_test)
{
    // P2PKH
    CheckMaxWeightComputation("453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c", {}, "76a914f60dcfd3392b28adc7662669603641f578eed72d88ac", 593);
    // P2SH-P2WPKH
    CheckMaxWeightComputation("160014001dca1b22c599b5a56a87c78417ad2ff39552f1", {"3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301", "026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7"}, "a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87", 364);
    // P2WPKH
    CheckMaxWeightComputation("", {"3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401", "0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79"}, "00149961a78658030cc824af4c54fbf5294bec0cabdd", 272);
    // P2WSH HTLC
    CheckMaxWeightComputation("", {"3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801", "01", "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"}, "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703", 318);
}